

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O0

char * uloc_getISO3Language_63(char *localeID)

{
  UBool UVar1;
  int16_t iVar2;
  UErrorCode local_2c;
  char local_26 [2];
  UErrorCode err;
  char lang [12];
  int16_t offset;
  char *localeID_local;
  
  local_2c = U_ZERO_ERROR;
  unique0x100000aa = localeID;
  if (localeID == (char *)0x0) {
    register0x00000000 = uloc_getDefault_63();
  }
  uloc_getLanguage_63(stack0xffffffffffffffe8,local_26,0xc,&local_2c);
  UVar1 = U_FAILURE(local_2c);
  if (UVar1 == '\0') {
    iVar2 = _findIndex(LANGUAGES,local_26);
    if (iVar2 < 0) {
      localeID_local = "";
    }
    else {
      localeID_local = LANGUAGES_3[iVar2];
    }
  }
  else {
    localeID_local = "";
  }
  return localeID_local;
}

Assistant:

U_CAPI const char*  U_EXPORT2
uloc_getISO3Language(const char* localeID)
{
    int16_t offset;
    char lang[ULOC_LANG_CAPACITY];
    UErrorCode err = U_ZERO_ERROR;

    if (localeID == NULL)
    {
        localeID = uloc_getDefault();
    }
    uloc_getLanguage(localeID, lang, ULOC_LANG_CAPACITY, &err);
    if (U_FAILURE(err))
        return "";
    offset = _findIndex(LANGUAGES, lang);
    if (offset < 0)
        return "";
    return LANGUAGES_3[offset];
}